

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void get_ls_tile_buffer(uint8_t *data_end,aom_internal_error_info *error_info,uint8_t **data,
                       TileBufferDec (*tile_buffers) [64],int tile_size_bytes,int col,int row,
                       int tile_copy_mode)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  long in_RCX;
  long *in_RDX;
  aom_internal_error_info *in_RSI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int offset;
  uint8_t *copy_data;
  size_t copy_size;
  size_t size;
  undefined8 uVar4;
  uint8_t *src;
  ulong local_30;
  
  src = (uint8_t *)0x0;
  uVar4 = 0;
  iVar1 = read_is_valid((uint8_t *)*in_RDX,(long)in_R8D,in_RDI);
  if (iVar1 == 0) {
    aom_internal_error(in_RSI,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile length");
  }
  sVar3 = mem_get_varsize(src,(int)((ulong)uVar4 >> 0x20));
  if (((int)copy_size == 0) || (sVar3 >> ((char)(in_R8D << 3) - 1U & 0x3f) != 1)) {
    local_30 = sVar3 + 1;
  }
  else {
    uVar2 = (uint)(sVar3 >> (((char)in_R8D + -1) * '\b' & 0x3fU)) & 0x7f;
    if ((int)(uint)copy_data < (int)uVar2) {
      aom_internal_error(in_RSI,AOM_CODEC_CORRUPT_FRAME,
                         "Invalid row offset in tile copy mode: row=%d offset=%d",
                         (ulong)(uint)copy_data,(ulong)uVar2);
    }
    uVar4 = *(undefined8 *)
             (in_RCX + (long)(int)((uint)copy_data - uVar2) * 0x400 + (long)in_R9D * 0x10);
    src = *(uint8_t **)
           (in_RCX + (long)(int)((uint)copy_data - uVar2) * 0x400 + (long)in_R9D * 0x10 + 8);
    local_30 = 0;
  }
  *in_RDX = *in_RDX + (long)in_R8D;
  if ((ulong)((long)in_RDI - *in_RDX) < local_30) {
    aom_internal_error(in_RSI,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile size");
  }
  if (local_30 == 0) {
    *(undefined8 *)(in_RCX + (long)(int)(uint)copy_data * 0x400 + (long)in_R9D * 0x10) = uVar4;
    *(uint8_t **)(in_RCX + (long)(int)(uint)copy_data * 0x400 + (long)in_R9D * 0x10 + 8) = src;
  }
  else {
    *(long *)(in_RCX + (long)(int)(uint)copy_data * 0x400 + (long)in_R9D * 0x10) = *in_RDX;
    *(ulong *)(in_RCX + (long)(int)(uint)copy_data * 0x400 + (long)in_R9D * 0x10 + 8) = local_30;
  }
  *in_RDX = local_30 + *in_RDX;
  return;
}

Assistant:

static inline void get_ls_tile_buffer(
    const uint8_t *const data_end, struct aom_internal_error_info *error_info,
    const uint8_t **data, TileBufferDec (*const tile_buffers)[MAX_TILE_COLS],
    int tile_size_bytes, int col, int row, int tile_copy_mode) {
  size_t size;

  size_t copy_size = 0;
  const uint8_t *copy_data = NULL;

  if (!read_is_valid(*data, tile_size_bytes, data_end))
    aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Truncated packet or corrupt tile length");
  size = mem_get_varsize(*data, tile_size_bytes);

  // If tile_copy_mode = 1, then the top bit of the tile header indicates copy
  // mode.
  if (tile_copy_mode && (size >> (tile_size_bytes * 8 - 1)) == 1) {
    // The remaining bits in the top byte signal the row offset
    int offset = (size >> (tile_size_bytes - 1) * 8) & 0x7f;
    if (offset > row) {
      aom_internal_error(
          error_info, AOM_CODEC_CORRUPT_FRAME,
          "Invalid row offset in tile copy mode: row=%d offset=%d", row,
          offset);
    }

    // Currently, only use tiles in same column as reference tiles.
    copy_data = tile_buffers[row - offset][col].data;
    copy_size = tile_buffers[row - offset][col].size;
    size = 0;
  } else {
    size += AV1_MIN_TILE_SIZE_BYTES;
  }

  *data += tile_size_bytes;

  if (size > (size_t)(data_end - *data))
    aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Truncated packet or corrupt tile size");

  if (size > 0) {
    tile_buffers[row][col].data = *data;
    tile_buffers[row][col].size = size;
  } else {
    tile_buffers[row][col].data = copy_data;
    tile_buffers[row][col].size = copy_size;
  }

  *data += size;
}